

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

TPZCompElSide __thiscall TPZCheckMesh::FindElement(TPZCheckMesh *this,int connect)

{
  TPZCompMesh *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  TPZCompEl **ppTVar4;
  TPZInterpolatedElement *this_01;
  TPZGeoEl *pTVar5;
  int64_t iVar6;
  uint uVar7;
  uint connect_00;
  int iVar8;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uint side;
  undefined4 in_register_00000034;
  TPZCompMesh *pTVar9;
  uint uVar10;
  ulong nelem;
  uint uVar11;
  TPZCompElSide TVar12;
  TPZCompMesh *local_68;
  
  uVar11 = (uint)*(undefined8 *)(*(long *)CONCAT44(in_register_00000034,connect) + 0x48);
  if (0 < (int)uVar11) {
    local_68 = this->fMesh;
    iVar8 = (int)in_RDX;
    uVar10 = *(uint *)&this->fOut;
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)
                           (*(long *)CONCAT44(in_register_00000034,connect) + 0x40),nelem);
      this_00 = (TPZCompMesh *)*ppTVar4;
      if (this_00 == (TPZCompMesh *)0x0) {
        uVar7 = 0;
        in_RDX = extraout_RDX;
      }
      else {
        this_01 = (TPZInterpolatedElement *)
                  __dynamic_cast(this_00,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
        pTVar5 = TPZCompEl::Reference((TPZCompEl *)this_00);
        uVar2 = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
        uVar7 = 5;
        in_RDX = extraout_RDX_00;
        if (0 < (int)uVar2) {
          side = 0;
          do {
            uVar3 = (**(code **)(*(long *)&(this_01->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x248))(this_01);
            bVar1 = 0 < (int)uVar3;
            if ((int)uVar3 < 1) {
              in_RDX = (ulong)uVar10;
              uVar7 = 0;
              pTVar9 = local_68;
            }
            else {
              iVar6 = TPZInterpolatedElement::SideConnectIndex(this_01,0,side);
              uVar7 = 1;
              in_RDX = (ulong)side;
              pTVar9 = this_00;
              if (iVar6 != iVar8) {
                do {
                  connect_00 = uVar7;
                  if (uVar3 == connect_00) {
                    uVar7 = 0;
                    goto LAB_010dd600;
                  }
                  iVar6 = TPZInterpolatedElement::SideConnectIndex(this_01,connect_00,side);
                  uVar7 = connect_00 + 1;
                } while (iVar6 != iVar8);
                uVar7 = 1;
                local_68 = this_00;
                uVar10 = side;
LAB_010dd600:
                in_RDX = (ulong)uVar10;
                bVar1 = (int)connect_00 < (int)uVar3;
                pTVar9 = local_68;
              }
            }
            uVar10 = (uint)in_RDX;
            local_68 = pTVar9;
            if (bVar1) goto LAB_010dd663;
            side = side + 1;
          } while (side != uVar2);
          uVar7 = 5;
        }
LAB_010dd663:
        if (uVar7 == 5) {
          uVar7 = 0;
        }
      }
      if ((uVar7 & 3) != 0) {
        *(uint *)&this->fOut = uVar10;
        this->fMesh = local_68;
        goto LAB_010dd6a8;
      }
      nelem = nelem + 1;
    } while (nelem != (uVar11 & 0x7fffffff));
    *(uint *)&this->fOut = uVar10;
  }
  this->fMesh = (TPZCompMesh *)0x0;
  *(undefined4 *)&this->fOut = 0xffffffff;
LAB_010dd6a8:
  TVar12._8_8_ = in_RDX;
  TVar12.fEl = (TPZCompEl *)this;
  return TVar12;
}

Assistant:

TPZCompElSide TPZCheckMesh::FindElement(int connect) {
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        TPZGeoEl *gel = cel->Reference();
        int ns = gel->NSides();
		
		for(int side=0; side<ns; side++) {
            int nsc = intel->NSideConnects(side);
            for (int ic=0; ic<nsc; ic++)
            {
                int64_t index = intel->SideConnectIndex(ic, side);
                if(index == connect) {
                    return TPZCompElSide(cel,side);
                }
			}
		}
	}
	TPZCompElSide nullside;
	return nullside;
}